

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::GetNumElConnected(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                    *this,TPZVec<int> *numelconnected)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  int64_t iVar5;
  long *plVar6;
  TPZBlock *in_RSI;
  long in_RDI;
  int64_t ind;
  int64_t i;
  TPZManVector<long,_10> destindex;
  TPZManVector<long,_10> firstind;
  int64_t numactive;
  int64_t lasteq;
  int64_t firsteq;
  int64_t seqn;
  TPZConnect *cn;
  int64_t ic;
  size_t in_stack_00000268;
  char *in_stack_00000270;
  int *in_stack_fffffffffffffe48;
  TPZBlock *in_stack_fffffffffffffe50;
  long *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  TPZEquationFilter *in_stack_fffffffffffffe68;
  TPZAdmChunkVector<TPZConnect,_10> *in_stack_fffffffffffffe70;
  TPZVec<long> *in_stack_fffffffffffffe80;
  TPZVec<long> *in_stack_fffffffffffffe88;
  TPZEquationFilter *in_stack_fffffffffffffe90;
  int64_t local_140;
  int64_t local_138;
  TPZVec<long> local_120 [3];
  TPZVec<long> local_b0 [3];
  int64_t local_40;
  long local_38;
  long local_30;
  int64_t local_28;
  TPZConnect *local_20;
  long local_18;
  TPZBlock *local_10;
  
  local_10 = in_RSI;
  (**(code **)(**(long **)(in_RDI + 8) + 0x78))();
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    this_00 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    iVar5 = TPZChunkVector<TPZConnect,_10>::NElements
                      (&this_00->super_TPZChunkVector<TPZConnect,_10>);
    if (iVar5 <= lVar1) break;
    TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
    local_20 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&in_stack_fffffffffffffe70->super_TPZChunkVector<TPZConnect,_10>,
                          (int64_t)in_stack_fffffffffffffe68);
    iVar3 = TPZConnect::HasDependency(local_20);
    if (((iVar3 == 0) && (bVar2 = TPZConnect::IsCondensed(local_20), !bVar2)) &&
       (local_28 = TPZConnect::SequenceNumber(local_20), -1 < local_28)) {
      TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
      iVar3 = TPZBlock::Position(in_stack_fffffffffffffe50,
                                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      local_30 = (long)iVar3;
      TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
      iVar4 = TPZBlock::Size(in_stack_fffffffffffffe50,
                             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      local_38 = (long)iVar3 + (long)iVar4;
      local_40 = TPZEquationFilter::NumActive
                           (in_stack_fffffffffffffe68,
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (int64_t)in_stack_fffffffffffffe58);
      if (local_40 != 0) {
        if (local_40 != local_38 - local_30) {
          pzinternal::DebugStopImpl(in_stack_00000270,in_stack_00000268);
        }
        TPZManVector<long,_10>::TPZManVector
                  ((TPZManVector<long,_10> *)in_stack_fffffffffffffe70,
                   (int64_t)in_stack_fffffffffffffe68);
        TPZManVector<long,_10>::TPZManVector
                  ((TPZManVector<long,_10> *)in_stack_fffffffffffffe70,
                   (int64_t)in_stack_fffffffffffffe68);
        for (local_138 = 0; local_138 < local_40; local_138 = local_138 + 1) {
          plVar6 = TPZVec<long>::operator[](local_b0,local_138);
          *plVar6 = local_138;
          in_stack_fffffffffffffe88 = (TPZVec<long> *)(local_30 + local_138);
          in_stack_fffffffffffffe90 =
               (TPZEquationFilter *)TPZVec<long>::operator[](local_120,local_138);
          (in_stack_fffffffffffffe90->super_TPZSavable)._vptr_TPZSavable =
               (_func_int **)in_stack_fffffffffffffe88;
        }
        TPZEquationFilter::Filter
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        for (local_140 = 0;
            in_stack_fffffffffffffe80 = (TPZVec<long> *)TPZVec<long>::size(local_120),
            local_140 < (long)in_stack_fffffffffffffe80; local_140 = local_140 + 1) {
          in_stack_fffffffffffffe70 = TPZCompMesh::ConnectVec(*(TPZCompMesh **)(in_RDI + 8));
          in_stack_fffffffffffffe68 =
               (TPZEquationFilter *)
               TPZChunkVector<TPZConnect,_10>::operator[]
                         (&in_stack_fffffffffffffe70->super_TPZChunkVector<TPZConnect,_10>,
                          (int64_t)in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe64 =
               TPZConnect::NElConnected((TPZConnect *)in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe50 = local_10;
          in_stack_fffffffffffffe58 = TPZVec<long>::operator[](local_120,local_140);
          in_stack_fffffffffffffe48 =
               TPZVec<int>::operator[]
                         ((TPZVec<int> *)in_stack_fffffffffffffe50,*in_stack_fffffffffffffe58);
          *in_stack_fffffffffffffe48 = in_stack_fffffffffffffe64;
        }
        TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_fffffffffffffe50);
        TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_fffffffffffffe50);
      }
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::GetNumElConnected(TPZVec <int> &numelconnected){
	int64_t ic;
	
	this->fMesh->ComputeNodElCon();
	
	for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) {
		TPZConnect &cn = this->fMesh->ConnectVec()[ic];
		if(cn.HasDependency() || cn.IsCondensed()) continue;
		int64_t seqn = cn.SequenceNumber();
		if(seqn < 0) continue;
		int64_t firsteq = this->fMesh->Block().Position(seqn);
		int64_t lasteq = firsteq+this->fMesh->Block().Size(seqn);
        int64_t numactive = this->fEquationFilter.NumActive(firsteq, lasteq);
		if(!numactive) continue;
        if (numactive != lasteq-firsteq) {
            DebugStop();
        }
        TPZManVector<int64_t> firstind(numactive),destindex(numactive);
        for (int64_t i = 0; i<numactive; i++) {
            firstind[i] = i;
            destindex[i] = firsteq+i;
        }
        this->fEquationFilter.Filter(firstind, destindex);
		for(int64_t ind=0;ind<destindex.size();ind++) 
			numelconnected[destindex[ind] ] = this->fMesh->ConnectVec()[ic].NElConnected();
	}
}